

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_cmpm_16(m68k_info *info)

{
  int in_stack_00000008;
  int in_stack_0000000c;
  m68k_info *in_stack_00000010;
  
  build_pi_pi(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  return;
}

Assistant:

static void d68000_cmpm_16(m68k_info *info)
{
	build_pi_pi(info, M68K_INS_CMPM, 2);
}